

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ParseObjectReset(Parse *pParse)

{
  undefined8 *in_RDI;
  ParseCleanup *pCleanup;
  sqlite3 *db;
  ExprList *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  u16 uVar1;
  undefined4 in_stack_ffffffffffffffe4;
  undefined8 *in_stack_ffffffffffffffe8;
  sqlite3 *db_00;
  
  db_00 = (sqlite3 *)*in_RDI;
  if (in_RDI[0x14] != 0) {
    sqlite3DbNNFreeNN(db_00,in_stack_ffffffffffffffe8);
  }
  while (in_RDI[0x19] != 0) {
    in_stack_ffffffffffffffe8 = (undefined8 *)in_RDI[0x19];
    in_RDI[0x19] = *in_stack_ffffffffffffffe8;
    (*(code *)in_stack_ffffffffffffffe8[2])(db_00,in_stack_ffffffffffffffe8[1]);
    sqlite3DbNNFreeNN(db_00,in_stack_ffffffffffffffe8);
  }
  if (in_RDI[10] != 0) {
    sqlite3DbNNFreeNN(db_00,in_stack_ffffffffffffffe8);
  }
  if (in_RDI[0xb] != 0) {
    sqlite3ExprListDelete
              ((sqlite3 *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8);
  }
  (db_00->lookaside).bDisable = (db_00->lookaside).bDisable - (uint)*(byte *)((long)in_RDI + 0x24);
  if ((db_00->lookaside).bDisable == 0) {
    uVar1 = (db_00->lookaside).szTrue;
  }
  else {
    uVar1 = 0;
  }
  (db_00->lookaside).sz = uVar1;
  db_00->pParse = (Parse *)in_RDI[0x21];
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ParseObjectReset(Parse *pParse){
  sqlite3 *db = pParse->db;
  assert( db!=0 );
  assert( db->pParse==pParse );
  assert( pParse->nested==0 );
#ifndef SQLITE_OMIT_SHARED_CACHE
  if( pParse->aTableLock ) sqlite3DbNNFreeNN(db, pParse->aTableLock);
#endif
  while( pParse->pCleanup ){
    ParseCleanup *pCleanup = pParse->pCleanup;
    pParse->pCleanup = pCleanup->pNext;
    pCleanup->xCleanup(db, pCleanup->pPtr);
    sqlite3DbNNFreeNN(db, pCleanup);
  }
  if( pParse->aLabel ) sqlite3DbNNFreeNN(db, pParse->aLabel);
  if( pParse->pConstExpr ){
    sqlite3ExprListDelete(db, pParse->pConstExpr);
  }
  assert( db->lookaside.bDisable >= pParse->disableLookaside );
  db->lookaside.bDisable -= pParse->disableLookaside;
  db->lookaside.sz = db->lookaside.bDisable ? 0 : db->lookaside.szTrue;
  assert( pParse->db->pParse==pParse );
  db->pParse = pParse->pOuterParse;
}